

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAp_kry.c
# Opt level: O2

void GSIter(sunrealtype gamma,N_Vector z,N_Vector x,WebData wdata)

{
  double dVar1;
  uint n;
  uint uVar2;
  uint uVar3;
  char cVar4;
  int i;
  uint uVar5;
  sunrealtype *psVar6;
  sunrealtype *psVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  sunrealtype *psVar11;
  uint uVar12;
  ulong uVar13;
  char cVar14;
  ulong uVar15;
  sunrealtype *psVar16;
  long lVar17;
  ulong uVar18;
  sunrealtype *psVar19;
  double dVar20;
  double dVar21;
  sunrealtype gam2 [6];
  sunrealtype gam [6];
  sunrealtype beta2 [6];
  sunrealtype beta [6];
  sunrealtype cof1 [6];
  
  psVar6 = (sunrealtype *)N_VGetArrayPointer(x);
  psVar7 = (sunrealtype *)N_VGetArrayPointer(z);
  n = wdata->ns;
  lVar17 = (long)(int)n;
  uVar2 = wdata->mx;
  uVar3 = wdata->my;
  lVar8 = (long)wdata->mxns;
  lVar9 = 0;
  uVar18 = 0;
  if (0 < (int)n) {
    uVar18 = (ulong)n;
  }
  for (; uVar18 * 8 - lVar9 != 0; lVar9 = lVar9 + 8) {
    dVar20 = *(double *)((long)wdata->cox + lVar9);
    dVar1 = *(double *)((long)wdata->coy + lVar9);
    dVar21 = 1.0 / ((dVar20 + dVar1) * (gamma + gamma) + 1.0);
    dVar20 = dVar20 * gamma * dVar21;
    *(double *)((long)beta + lVar9) = dVar20;
    *(double *)((long)beta2 + lVar9) = dVar20 + dVar20;
    dVar20 = dVar1 * gamma * dVar21;
    *(double *)((long)gam + lVar9) = dVar20;
    *(double *)((long)gam2 + lVar9) = dVar20 + dVar20;
    *(double *)((long)cof1 + lVar9) = dVar21;
  }
  uVar15 = 0;
  uVar18 = 0;
  if (0 < (int)uVar2) {
    uVar18 = (ulong)uVar2;
  }
  psVar19 = psVar6;
  uVar10 = 0;
  if (0 < (int)uVar3) {
    uVar10 = (ulong)uVar3;
  }
  for (; uVar13 = uVar18, psVar11 = psVar7, psVar16 = psVar19, uVar15 != uVar10; uVar15 = uVar15 + 1
      ) {
    while (uVar13 != 0) {
      v_prod(psVar16,cof1,psVar11,n);
      uVar13 = uVar13 - 1;
      psVar11 = psVar11 + lVar17;
      psVar16 = psVar16 + lVar17;
    }
    psVar7 = psVar7 + lVar8;
    psVar19 = psVar19 + lVar8;
  }
  N_VConst(0,z);
  uVar5 = 1;
  do {
    if (uVar5 == 6) {
      return;
    }
    if (1 < uVar5) {
      for (uVar15 = 0; uVar15 != uVar10; uVar15 = uVar15 + 1) {
        uVar12 = (uint)(uVar15 == uVar3 - 1) * 3 + 3;
        if (uVar15 == 0) {
          uVar12 = 0;
        }
        if (uVar18 != 0) {
          (*(code *)((long)&DAT_001050a8 + (long)(int)(&DAT_001050a8)[uVar12]))();
          return;
        }
      }
    }
    psVar7 = psVar6;
    for (uVar15 = 0; uVar15 != uVar10; uVar15 = uVar15 + 1) {
      cVar14 = (uVar15 == uVar3 - 1) * '\x03' + '\x03';
      if (uVar15 == 0) {
        cVar14 = '\0';
      }
      psVar19 = psVar7;
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        cVar4 = (uVar2 - 1 == uVar13) + '\x01';
        if (uVar13 == 0) {
          cVar4 = '\0';
        }
        switch(cVar4 + cVar14) {
        case '\x01':
          psVar11 = psVar19 + -lVar17;
          psVar16 = beta;
          break;
        case '\x02':
          psVar11 = psVar19 + -lVar17;
          psVar16 = beta2;
          break;
        case '\x03':
          goto switchD_001042c7_caseD_3;
        case '\x04':
          psVar11 = beta;
          goto LAB_0010430c;
        case '\x05':
          psVar11 = beta2;
LAB_0010430c:
          v_inc_by_prod(psVar19,psVar11,psVar19 + -lVar17,n);
switchD_001042c7_caseD_3:
          psVar11 = psVar19 + -lVar8;
          psVar16 = gam;
          break;
        case '\x06':
          goto switchD_001042c7_caseD_6;
        case '\a':
          psVar11 = beta;
          goto LAB_0010436a;
        case '\b':
          psVar11 = beta2;
LAB_0010436a:
          v_inc_by_prod(psVar19,psVar11,psVar19 + -lVar17,n);
switchD_001042c7_caseD_6:
          psVar11 = psVar19 + -lVar8;
          psVar16 = gam2;
          break;
        default:
          goto switchD_001042c7_default;
        }
        v_inc_by_prod(psVar19,psVar16,psVar11,n);
switchD_001042c7_default:
        psVar19 = psVar19 + lVar17;
      }
      psVar7 = psVar7 + lVar8;
    }
    N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,z,x,z);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static void GSIter(sunrealtype gamma, N_Vector z, N_Vector x, WebData wdata)
{
  int i, ic, iter, iyoff, jx, jy, ns, mxns, mx, my, x_loc, y_loc;
  sunrealtype beta[NS], beta2[NS], cof1[NS], gam[NS], gam2[NS];
  sunrealtype temp, *cox, *coy, *xd, *zd;

  xd   = N_VGetArrayPointer(x);
  zd   = N_VGetArrayPointer(z);
  ns   = wdata->ns;
  mx   = wdata->mx;
  my   = wdata->my;
  mxns = wdata->mxns;
  cox  = wdata->cox;
  coy  = wdata->coy;

  /* Write matrix as P = D - L - U.
     Load local arrays beta, beta2, gam, gam2, and cof1. */

  for (i = 0; i < ns; i++)
  {
    temp     = ONE / (ONE + TWO * gamma * (cox[i] + coy[i]));
    beta[i]  = gamma * cox[i] * temp;
    beta2[i] = TWO * beta[i];
    gam[i]   = gamma * coy[i] * temp;
    gam2[i]  = TWO * gam[i];
    cof1[i]  = temp;
  }

  /* Begin iteration loop.
  Load vector x with (D-inverse)*z for first iteration. */

  for (jy = 0; jy < my; jy++)
  {
    iyoff = mxns * jy;
    for (jx = 0; jx < mx; jx++)
    {
      ic = iyoff + ns * jx;
      v_prod(xd + ic, cof1, zd + ic, ns); /* x[ic+i] = cof1[i]z[ic+i] */
    }
  }
  N_VConst(ZERO, z);

  /* Looping point for iterations. */

  for (iter = 1; iter <= ITMAX; iter++)
  {
    /* Calculate (D-inverse)*U*x if not the first iteration. */

    if (iter > 1)
    {
      for (jy = 0; jy < my; jy++)
      {
        iyoff = mxns * jy;
        for (jx = 0; jx < mx; jx++)
        { /* order of loops matters */
          ic    = iyoff + ns * jx;
          x_loc = (jx == 0) ? 0 : ((jx == mx - 1) ? 2 : 1);
          y_loc = (jy == 0) ? 0 : ((jy == my - 1) ? 2 : 1);
          switch (3 * y_loc + x_loc)
          {
          case 0: /* jx == 0, jy == 0 */
            /* x[ic+i] = beta2[i]x[ic+ns+i] + gam2[i]x[ic+mxns+i] */
            v_sum_prods(xd + ic, beta2, xd + ic + ns, gam2, xd + ic + mxns, ns);
            break;
          case 1: /* 1 <= jx <= mx-2, jy == 0 */
            /* x[ic+i] = beta[i]x[ic+ns+i] + gam2[i]x[ic+mxns+i] */
            v_sum_prods(xd + ic, beta, xd + ic + ns, gam2, xd + ic + mxns, ns);
            break;
          case 2: /* jx == mx-1, jy == 0 */
            /* x[ic+i] = gam2[i]x[ic+mxns+i] */
            v_prod(xd + ic, gam2, xd + ic + mxns, ns);
            break;
          case 3: /* jx == 0, 1 <= jy <= my-2 */
            /* x[ic+i] = beta2[i]x[ic+ns+i] + gam[i]x[ic+mxns+i] */
            v_sum_prods(xd + ic, beta2, xd + ic + ns, gam, xd + ic + mxns, ns);
            break;
          case 4: /* 1 <= jx <= mx-2, 1 <= jy <= my-2 */
            /* x[ic+i] = beta[i]x[ic+ns+i] + gam[i]x[ic+mxns+i] */
            v_sum_prods(xd + ic, beta, xd + ic + ns, gam, xd + ic + mxns, ns);
            break;
          case 5: /* jx == mx-1, 1 <= jy <= my-2 */
            /* x[ic+i] = gam[i]x[ic+mxns+i] */
            v_prod(xd + ic, gam, xd + ic + mxns, ns);
            break;
          case 6: /* jx == 0, jy == my-1 */
            /* x[ic+i] = beta2[i]x[ic+ns+i] */
            v_prod(xd + ic, beta2, xd + ic + ns, ns);
            break;
          case 7: /* 1 <= jx <= mx-2, jy == my-1 */
            /* x[ic+i] = beta[i]x[ic+ns+i] */
            v_prod(xd + ic, beta, xd + ic + ns, ns);
            break;
          case 8: /* jx == mx-1, jy == my-1 */
            /* x[ic+i] = ZERO */
            v_zero(xd + ic, ns);
            break;
          }
        }
      }
    } /* end if (iter > 1) */

    /* Overwrite x with [(I - (D-inverse)*L)-inverse]*x. */

    for (jy = 0; jy < my; jy++)
    {
      iyoff = mxns * jy;
      for (jx = 0; jx < mx; jx++)
      { /* order of loops matters */
        ic    = iyoff + ns * jx;
        x_loc = (jx == 0) ? 0 : ((jx == mx - 1) ? 2 : 1);
        y_loc = (jy == 0) ? 0 : ((jy == my - 1) ? 2 : 1);
        switch (3 * y_loc + x_loc)
        {
        case 0: /* jx == 0, jy == 0 */ break;
        case 1: /* 1 <= jx <= mx-2, jy == 0 */
          /* x[ic+i] += beta[i]x[ic-ns+i] */
          v_inc_by_prod(xd + ic, beta, xd + ic - ns, ns);
          break;
        case 2: /* jx == mx-1, jy == 0 */
          /* x[ic+i] += beta2[i]x[ic-ns+i] */
          v_inc_by_prod(xd + ic, beta2, xd + ic - ns, ns);
          break;
        case 3: /* jx == 0, 1 <= jy <= my-2 */
          /* x[ic+i] += gam[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, gam, xd + ic - mxns, ns);
          break;
        case 4: /* 1 <= jx <= mx-2, 1 <= jy <= my-2 */
          /* x[ic+i] += beta[i]x[ic-ns+i] + gam[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, beta, xd + ic - ns, ns);
          v_inc_by_prod(xd + ic, gam, xd + ic - mxns, ns);
          break;
        case 5: /* jx == mx-1, 1 <= jy <= my-2 */
          /* x[ic+i] += beta2[i]x[ic-ns+i] + gam[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, beta2, xd + ic - ns, ns);
          v_inc_by_prod(xd + ic, gam, xd + ic - mxns, ns);
          break;
        case 6: /* jx == 0, jy == my-1 */
          /* x[ic+i] += gam2[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, gam2, xd + ic - mxns, ns);
          break;
        case 7: /* 1 <= jx <= mx-2, jy == my-1 */
          /* x[ic+i] += beta[i]x[ic-ns+i] + gam2[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, beta, xd + ic - ns, ns);
          v_inc_by_prod(xd + ic, gam2, xd + ic - mxns, ns);
          break;
        case 8: /* jx == mx-1, jy == my-1 */
          /* x[ic+i] += beta2[i]x[ic-ns+i] + gam2[i]x[ic-mxns+i] */
          v_inc_by_prod(xd + ic, beta2, xd + ic - ns, ns);
          v_inc_by_prod(xd + ic, gam2, xd + ic - mxns, ns);
          break;
        }
      }
    }

    /* Add increment x to z : z <- z+x */

    N_VLinearSum(ONE, z, ONE, x, z);
  }
}